

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O0

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalTableScan,duckdb::vector<duckdb::LogicalType,true>&,duckdb::TableFunction&,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<duckdb::ColumnIndex,true>&,duckdb::vector<unsigned_long,true>,duckdb::vector<std::__cxx11::string,true>&,duckdb::unique_ptr<duckdb::TableFilterSet,std::default_delete<duckdb::TableFilterSet>,true>,unsigned_long&,duckdb::ExtraOperatorInfo&,duckdb::vector<duckdb::Value,true>,std::unordered_map<unsigned_long,duckdb::TableColumn,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::TableColumn>>>>
          (PhysicalPlan *this,vector<duckdb::LogicalType,_true> *args,TableFunction *args_1,
          unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *args_2,
          vector<duckdb::LogicalType,_true> *args_3,vector<duckdb::ColumnIndex,_true> *args_4,
          vector<unsigned_long,_true> *args_5,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *args_6,unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                  *args_7,unsigned_long *args_8,ExtraOperatorInfo *args_9,
          vector<duckdb::Value,_true> *args_10,
          unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
          *args_11)

{
  PhysicalOperator *pPVar1;
  PhysicalTableScan *ptr;
  data_ptr_t mem;
  unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
  *in_stack_fffffffffffffc78;
  PhysicalTableScan *__uref;
  ArenaAllocator *in_stack_fffffffffffffc80;
  TableFunction *this_00;
  TableFunction *in_stack_fffffffffffffc88;
  TableFunction *in_stack_fffffffffffffc90;
  ExtraOperatorInfo *in_stack_fffffffffffffcb8;
  ExtraOperatorInfo *in_stack_fffffffffffffcc0;
  vector<duckdb::ColumnIndex,_true> *in_stack_fffffffffffffd48;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffd50;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
  *in_stack_fffffffffffffd58;
  TableFunction *in_stack_fffffffffffffd60;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffd68;
  PhysicalTableScan *in_stack_fffffffffffffd70;
  vector<unsigned_long,_true> *in_stack_fffffffffffffd80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_stack_fffffffffffffd88;
  undefined8 in_stack_fffffffffffffd90;
  undefined8 in_stack_fffffffffffffd98;
  ExtraOperatorInfo *in_stack_fffffffffffffda0;
  vector<duckdb::Value,_true> *in_stack_fffffffffffffda8;
  undefined8 in_stack_fffffffffffffdb0;
  
  pPVar1 = (PhysicalOperator *)
           ArenaAllocator::AllocateAligned
                     (in_stack_fffffffffffffc80,(idx_t)in_stack_fffffffffffffc78);
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffc80,
             (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffc78);
  TableFunction::TableFunction(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::unique_ptr
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             in_stack_fffffffffffffc80,
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             in_stack_fffffffffffffc78);
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffc80,
             (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffc78);
  vector<duckdb::ColumnIndex,_true>::vector
            ((vector<duckdb::ColumnIndex,_true> *)in_stack_fffffffffffffc80,
             (vector<duckdb::ColumnIndex,_true> *)in_stack_fffffffffffffc78);
  vector<unsigned_long,_true>::vector
            ((vector<unsigned_long,_true> *)in_stack_fffffffffffffc80,
             (vector<unsigned_long,_true> *)in_stack_fffffffffffffc78);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)in_stack_fffffffffffffc80,
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)in_stack_fffffffffffffc78);
  unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>::unique_ptr
            ((unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
              *)in_stack_fffffffffffffc80,
             (unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
              *)in_stack_fffffffffffffc78);
  ExtraOperatorInfo::ExtraOperatorInfo(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)in_stack_fffffffffffffc80,
             (vector<duckdb::Value,_true> *)in_stack_fffffffffffffc78);
  ::std::
  unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
  ::unordered_map((unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
                   *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  this_00 = (TableFunction *)&stack0xfffffffffffffd78;
  __uref = (PhysicalTableScan *)&stack0xfffffffffffffd90;
  PhysicalTableScan::PhysicalTableScan
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
             in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             in_stack_fffffffffffffd80,in_stack_fffffffffffffd88,
             (unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
              *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd98,in_stack_fffffffffffffda0,
             in_stack_fffffffffffffda8,(virtual_column_map_t *)in_stack_fffffffffffffdb0);
  ::std::
  unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
  ::~unordered_map((unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
                    *)0x76deee);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x76defb);
  ExtraOperatorInfo::~ExtraOperatorInfo((ExtraOperatorInfo *)this_00);
  unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>::~unique_ptr
            ((unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
              *)0x76df15);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  ~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *)0x76df22);
  vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0x76df2f);
  vector<duckdb::ColumnIndex,_true>::~vector((vector<duckdb::ColumnIndex,_true> *)0x76df3c);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x76df49);
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::~unique_ptr
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             0x76df56);
  TableFunction::~TableFunction(this_00);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x76df70);
  ::std::reference_wrapper<duckdb::PhysicalOperator>::
  reference_wrapper<duckdb::PhysicalTableScan&,void,duckdb::PhysicalOperator*>
            ((reference_wrapper<duckdb::PhysicalOperator> *)this_00,__uref);
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ::push_back((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               *)this_00,(value_type *)__uref);
  return pPVar1;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}